

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPart.c
# Opt level: O0

void Supp_ManStop(Supp_Man_t *p)

{
  int iVar1;
  void *__ptr;
  int local_1c;
  int i;
  void *pMemory;
  Supp_Man_t *p_local;
  
  for (local_1c = 0; iVar1 = Vec_PtrSize(p->vMemory), local_1c < iVar1; local_1c = local_1c + 1) {
    __ptr = Vec_PtrEntry(p->vMemory,local_1c);
    if (__ptr != (void *)0x0) {
      free(__ptr);
    }
  }
  Vec_PtrFree(p->vMemory);
  Vec_PtrFree(p->vFree);
  if (p != (Supp_Man_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Supp_ManStop( Supp_Man_t * p )
{
    void * pMemory;
    int i;
    Vec_PtrForEachEntry( void *, p->vMemory, pMemory, i )
        ABC_FREE( pMemory );
    Vec_PtrFree( p->vMemory );
    Vec_PtrFree( p->vFree );
    ABC_FREE( p );
}